

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O2

LispPTR LCGetIVValue(LispPTR object,LispPTR iv)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  uint uVar6;
  
  if (atom_instance == 0) {
    LCinit();
  }
  uVar4 = *(ushort *)((ulong)(object >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  if ((*(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5)) & 0xfffffff) ==
      atom_instance) {
    pLVar2 = NativeAligned4FromLAddr(object);
    uVar4 = pLVar2[1];
    uVar5 = (ulong)(((uVar4 ^ iv) & 0x3ff) << 4);
    pLVar3 = (LispPTR *)((long)&LCIVCache->iNames + uVar5);
    if ((*(uint *)((long)&LCIVCache->iNames + uVar5) == uVar4) && (pLVar3[1] == iv)) {
      uVar6 = (uint)(ushort)pLVar3[2];
LAB_00126e83:
      pLVar3 = NativeAligned4FromLAddr(pLVar2[2]);
      uVar4 = *(ushort *)((ulong)(pLVar3[uVar6] >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if ((*(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5)) & 0xfffffff) !=
          atom_annotatedValue) {
        return pLVar3[uVar6];
      }
    }
    else if ((*(ushort *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
      uVar6 = 0;
      do {
        LVar1 = car(uVar4);
        if (LVar1 == iv) {
          *pLVar3 = pLVar2[1];
          pLVar3[1] = iv;
          pLVar3[2] = uVar6 | 0xe0000;
          goto LAB_00126e83;
        }
        uVar6 = uVar6 + 1;
        uVar4 = cdr(uVar4);
      } while (uVar4 != 0);
    }
  }
  lcfuncall(atom_GetIVValue_LCUFN,2,3);
  return 0xfffffffe;
}

Assistant:

LispPTR LCGetIVValue(LispPTR object, LispPTR iv) {
  struct LCInstance *objptr;
  LispPTR val;
  int index;

  LC_INIT;
  INSTANCE_OR_PUNT(object, atom_GetIVValue_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  GET_IV_INDEX(objptr, iv, index, goto pnut);
  val = ((LispPTR *)NativeAligned4FromLAddr(objptr->iDescrs))[index];
  if (!LC_TYPEP(val, atom_annotatedValue)) return val;
pnut:
  RETCALL(atom_GetIVValue_LCUFN, 2);
  /*
    return LCGetActiveValue(object,val);
  */
}